

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * QLocale::scriptToCode(QString *__return_storage_ptr__,Script script)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  uchar *puVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = 0xff71 < (script - 0x8f & 0xffff);
  puVar6 = (uchar *)0x0;
  if (bVar7) {
    puVar6 = "ZzzzAdlmAhomHluwArabArmnAvstBaliBamuBengBassBatkBhksBopoBrahBraiBugiBuhdCansCariAghbCakmChamCherCoptXsuxCprtCyrlDsrtDevaDuplEgypElbaEthiLisuGeorGlagGothGranGrekGujrGuruHangHaniHanoHanbHatrHebrHiraArmiPhliPrtiJamoJpanJavaKthiKndaKanaKaliKharKhmrKhojSindKoreLanaLaooLatnLepcLimbLinaLinbLyciLydiMahjMlymMandManiMarcMteiMendMercMeroModiMongMrooMultMymrNbatNewaTaluNkooOryaOgamOlckHungItalNarbPermXpeoSarbOrkhOsgeOsmaHmngPalmPaucPhagPhnxPlrdPhlpRjngRunrSamrSaurShrdShawSiddSgnwHansSinhSoraSundSyloSyrcTglgTagbTaleTavtTakrTamlTangTeluThaaThaiTibtTfngTirhHantUgarVaiiWaraYiiiRohg"
             + (ulong)(script & 0x3fff) * 4;
  }
  ba.m_data = (storage_type *)
              (
              "ZzzzAdlmAhomHluwArabArmnAvstBaliBamuBengBassBatkBhksBopoBrahBraiBugiBuhdCansCariAghbCakmChamCherCoptXsuxCprtCyrlDsrtDevaDuplEgypElbaEthiLisuGeorGlagGothGranGrekGujrGuruHangHaniHanoHanbHatrHebrHiraArmiPhliPrtiJamoJpanJavaKthiKndaKanaKaliKharKhmrKhojSindKoreLanaLaooLatnLepcLimbLinaLinbLyciLydiMahjMlymMandManiMarcMteiMendMercMeroModiMongMrooMultMymrNbatNewaTaluNkooOryaOgamOlckHungItalNarbPermXpeoSarbOrkhOsgeOsmaHmngPalmPaucPhagPhnxPlrdPhlpRjngRunrSamrSaurShrdShawSiddSgnwHansSinhSoraSundSyloSyrcTglgTagbTaleTavtTakrTamlTangTeluThaaThaiTibtTfngTirhHantUgarVaiiWaraYiiiRohg"
              + (ulong)(script & 0x3fff) * 4);
  ba.m_size = (qsizetype)puVar6;
  QString::fromLatin1(&local_38,(QString *)((ulong)bVar7 << 2),ba);
  qVar5 = local_38.d.size;
  uVar1 = local_38.d.d._0_4_;
  uVar2 = local_38.d.d._4_4_;
  uVar3 = local_38.d.ptr._0_4_;
  uVar4 = local_38.d.ptr._4_4_;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar4;
  local_38.d.size = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::scriptToCode(Script script)
{
    return QLocalePrivate::scriptToCode(script);
}